

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_enc.c
# Opt level: O0

int WebPValidateConfig(WebPConfig *config)

{
  WebPConfig *config_local;
  int local_4;
  
  if (config == (WebPConfig *)0x0) {
    local_4 = 0;
  }
  else if ((config->quality <= 0.0 && config->quality != 0.0) || (100.0 < config->quality)) {
    local_4 = 0;
  }
  else if (config->target_size < 0) {
    local_4 = 0;
  }
  else if (0.0 < config->target_PSNR || config->target_PSNR == 0.0) {
    if ((config->method < 0) || (6 < config->method)) {
      local_4 = 0;
    }
    else if ((config->segments < 1) || (4 < config->segments)) {
      local_4 = 0;
    }
    else if ((config->sns_strength < 0) || (100 < config->sns_strength)) {
      local_4 = 0;
    }
    else if ((config->filter_strength < 0) || (100 < config->filter_strength)) {
      local_4 = 0;
    }
    else if ((config->filter_sharpness < 0) || (7 < config->filter_sharpness)) {
      local_4 = 0;
    }
    else if ((config->filter_type < 0) || (1 < config->filter_type)) {
      local_4 = 0;
    }
    else if ((config->autofilter < 0) || (1 < config->autofilter)) {
      local_4 = 0;
    }
    else if ((config->pass < 1) || (10 < config->pass)) {
      local_4 = 0;
    }
    else if (((config->qmin < 0) || (100 < config->qmax)) || (config->qmax < config->qmin)) {
      local_4 = 0;
    }
    else if ((config->show_compressed < 0) || (1 < config->show_compressed)) {
      local_4 = 0;
    }
    else if ((config->preprocessing < 0) || (7 < config->preprocessing)) {
      local_4 = 0;
    }
    else if ((config->partitions < 0) || (3 < config->partitions)) {
      local_4 = 0;
    }
    else if ((config->partition_limit < 0) || (100 < config->partition_limit)) {
      local_4 = 0;
    }
    else if (config->alpha_compression < 0) {
      local_4 = 0;
    }
    else if (config->alpha_filtering < 0) {
      local_4 = 0;
    }
    else if ((config->alpha_quality < 0) || (100 < config->alpha_quality)) {
      local_4 = 0;
    }
    else if ((config->lossless < 0) || (1 < config->lossless)) {
      local_4 = 0;
    }
    else if ((config->near_lossless < 0) || (100 < config->near_lossless)) {
      local_4 = 0;
    }
    else if (config->image_hint < WEBP_HINT_LAST) {
      if ((config->emulate_jpeg_size < 0) || (1 < config->emulate_jpeg_size)) {
        local_4 = 0;
      }
      else if ((config->thread_level < 0) || (1 < config->thread_level)) {
        local_4 = 0;
      }
      else if ((config->low_memory < 0) || (1 < config->low_memory)) {
        local_4 = 0;
      }
      else if ((config->exact < 0) || (1 < config->exact)) {
        local_4 = 0;
      }
      else if ((config->use_sharp_yuv < 0) || (1 < config->use_sharp_yuv)) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int WebPValidateConfig(const WebPConfig* config) {
  if (config == NULL) return 0;
  if (config->quality < 0 || config->quality > 100) return 0;
  if (config->target_size < 0) return 0;
  if (config->target_PSNR < 0) return 0;
  if (config->method < 0 || config->method > 6) return 0;
  if (config->segments < 1 || config->segments > 4) return 0;
  if (config->sns_strength < 0 || config->sns_strength > 100) return 0;
  if (config->filter_strength < 0 || config->filter_strength > 100) return 0;
  if (config->filter_sharpness < 0 || config->filter_sharpness > 7) return 0;
  if (config->filter_type < 0 || config->filter_type > 1) return 0;
  if (config->autofilter < 0 || config->autofilter > 1) return 0;
  if (config->pass < 1 || config->pass > 10) return 0;
  if (config->qmin < 0 || config->qmax > 100 || config->qmin > config->qmax) {
    return 0;
  }
  if (config->show_compressed < 0 || config->show_compressed > 1) return 0;
  if (config->preprocessing < 0 || config->preprocessing > 7) return 0;
  if (config->partitions < 0 || config->partitions > 3) return 0;
  if (config->partition_limit < 0 || config->partition_limit > 100) return 0;
  if (config->alpha_compression < 0) return 0;
  if (config->alpha_filtering < 0) return 0;
  if (config->alpha_quality < 0 || config->alpha_quality > 100) return 0;
  if (config->lossless < 0 || config->lossless > 1) return 0;
  if (config->near_lossless < 0 || config->near_lossless > 100) return 0;
  if (config->image_hint >= WEBP_HINT_LAST) return 0;
  if (config->emulate_jpeg_size < 0 || config->emulate_jpeg_size > 1) return 0;
  if (config->thread_level < 0 || config->thread_level > 1) return 0;
  if (config->low_memory < 0 || config->low_memory > 1) return 0;
  if (config->exact < 0 || config->exact > 1) return 0;
  if (config->use_sharp_yuv < 0 || config->use_sharp_yuv > 1) return 0;

  return 1;
}